

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

unique_ptr<Sock,_std::default_delete<Sock>_> CreateSockOS(int domain,int type,int protocol)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  pointer pSVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  __uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000090;
  int on;
  __single_object sock;
  SOCKET hSocket;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffedc;
  undefined8 in_stack_fffffffffffffee0;
  unique_ptr<Sock,_std::default_delete<Sock>_> *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  LogFlags in_stack_ffffffffffffff40;
  undefined4 local_7c;
  ConstevalFormatString<0U> in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffff90;
  string_view in_stack_ffffffffffffffa0;
  unique_ptr<Sock,_std::default_delete<Sock>_> local_28 [4];
  long local_8;
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(nullptr_t)0xe0ae32);
  }
  else {
    iVar2 = socket(in_ESI,in_EDX,in_ECX);
    if (iVar2 == -1) {
      std::unique_ptr<Sock,std::default_delete<Sock>>::unique_ptr<std::default_delete<Sock>,void>
                ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),(nullptr_t)0xe0ae67);
    }
    else {
      std::make_unique<Sock,unsigned_int&>
                ((uint *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      if (((in_ESI == 2) || (in_ESI == 10)) || (in_ESI == 1)) {
        pSVar5 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                           ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        uVar3 = (*pSVar5->_vptr_Sock[0xd])();
        if ((uVar3 & 1) == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
          uVar6 = 2;
          LogPrintFormatInternal<>
                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90,in_ECX,
                     in_stack_ffffffffffffff40,in_stack_00000080,in_stack_ffffffffffffff88);
          std::unique_ptr<Sock,std::default_delete<Sock>>::
          unique_ptr<std::default_delete<Sock>,void>
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                     CONCAT44(in_stack_fffffffffffffedc,uVar6),(nullptr_t)0xe0af6a);
        }
        else {
          pSVar5 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                             ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                              CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
          uVar3 = (*pSVar5->_vptr_Sock[0xc])();
          if ((uVar3 & 1) == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
            __errno_location();
            NetworkErrorString_abi_cxx11_(iVar4);
            in_stack_fffffffffffffee8 = local_28;
            uVar6 = 2;
            LogPrintFormatInternal<std::__cxx11::string>
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90,in_ECX,
                       in_stack_ffffffffffffff40,in_stack_00000080,
                       (ConstevalFormatString<1U>)in_stack_ffffffffffffff88.fmt,in_stack_00000090);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffedc,uVar6));
            std::unique_ptr<Sock,std::default_delete<Sock>>::
            unique_ptr<std::default_delete<Sock>,void>
                      ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                       CONCAT44(in_stack_fffffffffffffedc,uVar6),(nullptr_t)0xe0b072);
          }
          else if (in_ESI == 1) {
            std::unique_ptr<Sock,_std::default_delete<Sock>_>::unique_ptr
                      ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (unique_ptr<Sock,_std::default_delete<Sock>_> *)0xe0b0bc);
          }
          else {
            if (in_ECX == 6) {
              local_7c = 1;
              pSVar5 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                                 ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                                  CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
              iVar4 = (*pSVar5->_vptr_Sock[10])(pSVar5,6,1,&local_7c,4);
              if ((iVar4 == -1) &&
                 (bVar1 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffedc,
                                                     in_stack_fffffffffffffed8),Trace), bVar1)) {
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
                in_stack_fffffffffffffed8 = 1;
                LogPrintFormatInternal<>
                          (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff90,in_ECX,
                           in_stack_ffffffffffffff40,in_stack_00000080,in_stack_ffffffffffffff88);
              }
            }
            std::unique_ptr<Sock,_std::default_delete<Sock>_>::unique_ptr
                      ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                       CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                       (unique_ptr<Sock,_std::default_delete<Sock>_> *)0xe0b1d9);
          }
        }
      }
      else {
        std::unique_ptr<Sock,_std::default_delete<Sock>_>::unique_ptr
                  ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                   (unique_ptr<Sock,_std::default_delete<Sock>_> *)0xe0aea8);
      }
      std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr(in_stack_fffffffffffffee8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
         (tuple<Sock_*,_std::default_delete<Sock>_>)
         in_RDI.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
         super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
         super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Sock> CreateSockOS(int domain, int type, int protocol)
{
    // Not IPv4, IPv6 or UNIX
    if (domain == AF_UNSPEC) return nullptr;

    // Create a socket in the specified address family.
    SOCKET hSocket = socket(domain, type, protocol);
    if (hSocket == INVALID_SOCKET) {
        return nullptr;
    }

    auto sock = std::make_unique<Sock>(hSocket);

    if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNIX) {
        return sock;
    }

    // Ensure that waiting for I/O on this socket won't result in undefined
    // behavior.
    if (!sock->IsSelectable()) {
        LogPrintf("Cannot create connection: non-selectable socket created (fd >= FD_SETSIZE ?)\n");
        return nullptr;
    }

#ifdef SO_NOSIGPIPE
    int set = 1;
    // Set the no-sigpipe option on the socket for BSD systems, other UNIXes
    // should use the MSG_NOSIGNAL flag for every send.
    if (sock->SetSockOpt(SOL_SOCKET, SO_NOSIGPIPE, (void*)&set, sizeof(int)) == SOCKET_ERROR) {
        LogPrintf("Error setting SO_NOSIGPIPE on socket: %s, continuing anyway\n",
                  NetworkErrorString(WSAGetLastError()));
    }
#endif

    // Set the non-blocking option on the socket.
    if (!sock->SetNonBlocking()) {
        LogPrintf("Error setting socket to non-blocking: %s\n", NetworkErrorString(WSAGetLastError()));
        return nullptr;
    }

#ifdef HAVE_SOCKADDR_UN
    if (domain == AF_UNIX) return sock;
#endif

    if (protocol == IPPROTO_TCP) {
        // Set the no-delay option (disable Nagle's algorithm) on the TCP socket.
        const int on{1};
        if (sock->SetSockOpt(IPPROTO_TCP, TCP_NODELAY, &on, sizeof(on)) == SOCKET_ERROR) {
            LogDebug(BCLog::NET, "Unable to set TCP_NODELAY on a newly created socket, continuing anyway\n");
        }
    }

    return sock;
}